

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectivePosition::exec(CDirectivePosition *this)

{
  CDirectivePosition *this_local;
  
  if (this->type == Physical) {
    FileManager::seekPhysical(g_fileManager,this->position);
  }
  else if (this->type == Virtual) {
    FileManager::seekVirtual(g_fileManager,this->position);
  }
  return;
}

Assistant:

void CDirectivePosition::exec() const
{
	switch (type)
	{
	case Physical:
		g_fileManager->seekPhysical(position);
		break;
	case Virtual:
		g_fileManager->seekVirtual(position);
		break;
	}
}